

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func_lib.hpp
# Opt level: O3

void __thiscall
deci::binop_t<deci::and_xclass_t>::Evaluate
          (binop_t<deci::and_xclass_t> *this,vm_t *param_1,stack_t *stack,stack_t *local)

{
  int iVar1;
  value_t *pvVar2;
  long lVar3;
  long lVar4;
  double val;
  undefined1 auVar5 [16];
  number_t local_30;
  
  pvVar2 = stack_t::Top(stack,1);
  lVar3 = __dynamic_cast(pvVar2,&value_t::typeinfo,&number_t::typeinfo,0);
  if (lVar3 != 0) {
    pvVar2 = stack_t::Top(stack,0);
    lVar4 = __dynamic_cast(pvVar2,&value_t::typeinfo,&number_t::typeinfo,0);
    if (lVar4 != 0) {
      auVar5._0_4_ = -(uint)((int)*(double *)(lVar4 + 0x10) == 0);
      auVar5._4_4_ = -(uint)((int)*(double *)(lVar4 + 0x10) == 0);
      auVar5._8_4_ = -(uint)((int)*(double *)(lVar3 + 0x10) == 0);
      auVar5._12_4_ = -(uint)((int)*(double *)(lVar3 + 0x10) == 0);
      iVar1 = movmskpd((int)lVar4,auVar5);
      if (iVar1 == 0) {
        val = 1.0;
      }
      else {
        val = 0.0;
      }
      number_t::number_t(&local_30,val);
      stack_t::Result(local,&local_30.super_value_t);
      number_t::~number_t(&local_30);
      return;
    }
  }
  __cxa_bad_cast();
}

Assistant:

void Evaluate(vm_t&, const stack_t& stack, stack_t& local) override {
      number_t& a = dynamic_cast<number_t&>(stack.Top(1));
      number_t& b = dynamic_cast<number_t&>(stack.Top(0));
      local.Result(number_t(xclass::Execute(a.Value(), b.Value())));
    }